

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::AppendTarget
          (cmExtraSublimeTextGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmLocalGenerator *lg,cmGeneratorTarget *target,char *make,cmMakefile *makefile,
          char *param_7,MapSourceFileFlags *sourceFileFlags,bool firstTarget)

{
  pointer pbVar1;
  cmSourceFile *this_00;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  RegularExpression *this_01;
  iterator iVar6;
  ostream *poVar7;
  char *pcVar8;
  pointer ppcVar9;
  _Base_ptr this_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar10;
  string flagsString;
  string workString;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  string definesString;
  string includesString;
  string makefileName;
  undefined1 local_228 [32];
  size_type local_208;
  pointer local_200;
  undefined8 local_1f8;
  char *local_1f0;
  size_type local_1e8;
  pointer local_1e0;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_198;
  string *local_180;
  string local_178;
  string local_158;
  cmExtraSublimeTextGenerator *local_138;
  cmGeneratedFileStream *local_130;
  char *local_128;
  cmGeneratorTarget *local_120;
  _Base_ptr local_118;
  pointer local_110;
  pointer local_108;
  undefined1 local_100 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0 [2];
  char *local_b0;
  char *local_60;
  char *local_50;
  char *local_40;
  int local_38;
  
  local_180 = targetName;
  local_128 = make;
  if (target != (cmGeneratorTarget *)0x0) {
    local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"CMAKE_BUILD_TYPE","");
    psVar5 = cmMakefile::GetSafeDefinition(makefile,(string *)local_100);
    cmGeneratorTarget::GetSourceFiles(target,&local_198,psVar5);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
    }
    local_110 = local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_118 = &(sourceFileFlags->_M_t)._M_impl.super__Rb_tree_header._M_header;
      ppcVar9 = local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_138 = this;
      local_130 = fout;
      local_120 = target;
      do {
        this_00 = *ppcVar9;
        local_108 = ppcVar9;
        this_01 = (RegularExpression *)
                  cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::find(&sourceFileFlags->_M_t,(key_type *)this_01);
        if (iVar6._M_node == local_118) {
          psVar5 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
          local_228._0_8_ = (pointer)0x0;
          local_228._8_8_ = (pointer)0x0;
          local_228._16_8_ = (pointer)0x0;
          local_100._0_8_ = local_100 + 0x10;
          pcVar2 = (psVar5->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_100,pcVar2,pcVar2 + psVar5->_M_string_length);
          local_e0[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228._0_8_;
          local_e0[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
          local_e0[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_228._16_8_;
          local_228._0_8_ = (pointer)0x0;
          local_228._8_8_ = (pointer)0x0;
          local_228._16_8_ = (pointer)0x0;
          this_01 = (RegularExpression *)local_100;
          pVar10 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                   ::
                   _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                               *)sourceFileFlags,
                              (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_100);
          iVar6._M_node = (_Base_ptr)pVar10.first._M_node;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(local_e0);
          if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
            this_01 = (RegularExpression *)(CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
            operator_delete((void *)local_100._0_8_,(ulong)this_01);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_228);
        }
        ComputeFlagsForObject_abi_cxx11_
                  ((string *)local_1d8,(cmExtraSublimeTextGenerator *)this_01,this_00,lg,target);
        ComputeDefines_abi_cxx11_
                  (&local_178,(cmExtraSublimeTextGenerator *)this_01,this_00,lg,target);
        ComputeIncludes_abi_cxx11_
                  (&local_158,(cmExtraSublimeTextGenerator *)this_01,this_00,lg,target);
        this_02 = iVar6._M_node + 2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_02,*(pointer *)this_02);
        local_50 = (char *)0x0;
        local_40 = (char *)0x0;
        local_38 = 0;
        memset((RegularExpression *)local_100,0,0xaa);
        cmsys::RegularExpression::compile
                  ((RegularExpression *)local_100,
                   "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?");
        local_228._0_8_ = local_1d8._8_8_;
        local_228._8_8_ = local_1d8._0_8_;
        local_228._16_8_ = (pointer)0x1;
        local_228._24_8_ = (long)"\'\nfailed with:\n " + 0xf;
        local_208 = local_178._M_string_length;
        local_200 = local_178._M_dataplus._M_p;
        local_1f8 = 1;
        local_1f0 = " ";
        local_1e8 = local_158._M_string_length;
        local_1e0 = local_158._M_dataplus._M_p;
        views._M_len = 5;
        views._M_array = (iterator)local_228;
        cmCatViews_abi_cxx11_((string *)&local_1b8,views);
        while (bVar3 = cmsys::RegularExpression::find
                                 ((RegularExpression *)local_100,
                                  (char *)local_1b8._M_allocated_capacity,
                                  (RegularExpressionMatch *)local_100), bVar3) {
          std::__cxx11::string::substr((ulong)local_228,(ulong)&local_1b8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228)
          ;
          if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
            operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
          }
          if ((ulong)((long)local_b0 - (long)local_60) < (ulong)local_1b8._8_8_) {
            std::__cxx11::string::substr((ulong)local_228,(ulong)&local_1b8);
            std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,(string *)local_228);
            if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
            }
          }
          else {
            local_1b8._8_8_ = 0;
            *(char *)local_1b8._M_allocated_capacity = '\0';
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_allocated_capacity != &local_1a8) {
          operator_delete((void *)local_1b8._M_allocated_capacity,
                          local_1a8._M_allocated_capacity + 1);
        }
        if (local_40 != (char *)0x0) {
          operator_delete__(local_40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        ppcVar9 = local_108 + 1;
        this = local_138;
        fout = local_130;
      } while (ppcVar9 != local_110);
    }
    if (local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_198.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_100._8_8_ = (char *)0x0;
  local_100[0x10] = '\0';
  local_100._0_8_ = local_100 + 0x10;
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_228);
  iVar4 = std::__cxx11::string::compare(local_228);
  pbVar1 = (pointer)(local_228 + 0x10);
  if ((pointer)local_228._0_8_ != pbVar1) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  pcVar8 = "Makefile";
  if (iVar4 == 0) {
    pcVar8 = "build.ninja";
  }
  std::__cxx11::string::_M_replace((ulong)local_100,0,(char *)local_100._8_8_,(ulong)pcVar8);
  if (!firstTarget) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,",\n\t",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t{\n\t\t\t\"name\": \"",0xf);
  cmLocalGenerator::GetProjectName_abi_cxx11_((string *)local_228,lg);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(char *)local_228._0_8_,local_228._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(local_180->_M_dataplus)._M_p,local_180->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\",\n",3);
  if ((pointer)local_228._0_8_ != pbVar1) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\"cmd\": [",0xb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d8,local_128,(allocator<char> *)&local_178);
  BuildMakeCommand((string *)local_228,this,(string *)local_1d8,(string *)local_100,local_180);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(char *)local_228._0_8_,local_228._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"],\n",3);
  if ((pointer)local_228._0_8_ != pbVar1) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
  }
  if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\t\t\"working_dir\": \"${project_path}\",\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,
             "\t\t\t\"file_regex\": \"^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)\"\n"
             ,0x4e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t}",3);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& targetName,
  cmLocalGenerator* lg, cmGeneratorTarget* target, const char* make,
  const cmMakefile* makefile, const char* /*compiler*/,
  MapSourceFileFlags& sourceFileFlags, bool firstTarget)
{

  if (target != nullptr) {
    std::vector<cmSourceFile*> sourceFiles;
    target->GetSourceFiles(sourceFiles,
                           makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    for (cmSourceFile* sourceFile : sourceFiles) {
      auto sourceFileFlagsIter =
        sourceFileFlags.find(sourceFile->ResolveFullPath());
      if (sourceFileFlagsIter == sourceFileFlags.end()) {
        sourceFileFlagsIter =
          sourceFileFlags
            .insert(MapSourceFileFlags::value_type(
              sourceFile->ResolveFullPath(), std::vector<std::string>()))
            .first;
      }
      std::vector<std::string>& flags = sourceFileFlagsIter->second;
      std::string flagsString =
        this->ComputeFlagsForObject(sourceFile, lg, target);
      std::string definesString = this->ComputeDefines(sourceFile, lg, target);
      std::string includesString =
        this->ComputeIncludes(sourceFile, lg, target);
      flags.clear();
      cmsys::RegularExpression flagRegex;
      // Regular expression to extract compiler flags from a string
      // https://gist.github.com/3944250
      const char* regexString =
        R"((^|[ ])-[DIOUWfgs][^= ]+(=\"[^"]+\"|=[^"][^ ]+)?)";
      flagRegex.compile(regexString);
      std::string workString =
        cmStrCat(flagsString, " ", definesString, " ", includesString);
      while (flagRegex.find(workString)) {
        std::string::size_type start = flagRegex.start();
        if (workString[start] == ' ') {
          start++;
        }
        flags.push_back(workString.substr(start, flagRegex.end() - start));
        if (flagRegex.end() < workString.size()) {
          workString = workString.substr(flagRegex.end());
        } else {
          workString.clear();
        }
      }
    }
  }

  // Ninja uses ninja.build files (look for a way to get the output file name
  // from cmMakefile or something)
  std::string makefileName;
  if (this->GlobalGenerator->GetName() == "Ninja") {
    makefileName = "build.ninja";
  } else {
    makefileName = "Makefile";
  }
  if (!firstTarget) {
    fout << ",\n\t";
  }
  fout << "\t{\n\t\t\t\"name\": \"" << lg->GetProjectName() << " - "
       << targetName << "\",\n";
  fout << "\t\t\t\"cmd\": ["
       << this->BuildMakeCommand(make, makefileName, targetName) << "],\n";
  fout << "\t\t\t\"working_dir\": \"${project_path}\",\n";
  fout << "\t\t\t\"file_regex\": \""
          "^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)"
          "\"\n";
  fout << "\t\t}";
}